

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::TraceRaysIndirect
          (DeviceContextVkImpl *this,TraceRaysIndirectAttribs *Attribs)

{
  Uint64 UVar1;
  ShaderBindingTableVkImpl *this_00;
  BindingTableVk *RaygenShaderBindingTable;
  BufferVkImpl *this_01;
  VkDeviceAddress VVar2;
  Uint64 IndirectBuffOffset;
  BufferVkImpl *pIndirectAttribsVk;
  BindingTableVk *BindingTable;
  ShaderBindingTableVkImpl *pSBTVk;
  TraceRaysIndirectAttribs *Attribs_local;
  DeviceContextVkImpl *this_local;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::TraceRaysIndirect
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,Attribs,0);
  this_00 = ClassPtrCast<Diligent::ShaderBindingTableVkImpl_const,Diligent::IShaderBindingTable_const>
                      (Attribs->pSBT);
  RaygenShaderBindingTable = ShaderBindingTableVkImpl::GetVkBindingTable(this_00);
  this_01 = PrepareIndirectAttribsBuffer
                      (this,Attribs->pAttribsBuffer,Attribs->AttribsBufferStateTransitionMode,
                       "Trace rays indirect (DeviceContextVkImpl::TraceRaysIndirect)");
  UVar1 = Attribs->ArgsByteOffset;
  PrepareForRayTracing(this);
  VVar2 = BufferVkImpl::GetVkDeviceAddress(this_01);
  VulkanUtilities::VulkanCommandBuffer::TraceRaysIndirect
            (&this->m_CommandBuffer,&RaygenShaderBindingTable->RaygenShader,
             &RaygenShaderBindingTable->MissShader,&RaygenShaderBindingTable->HitShader,
             &RaygenShaderBindingTable->CallableShader,VVar2 + UVar1 + 0x58);
  (this->m_State).NumCommands = (this->m_State).NumCommands + 1;
  return;
}

Assistant:

void DeviceContextVkImpl::TraceRaysIndirect(const TraceRaysIndirectAttribs& Attribs)
{
    TDeviceContextBase::TraceRaysIndirect(Attribs, 0);

    const ShaderBindingTableVkImpl* pSBTVk       = ClassPtrCast<const ShaderBindingTableVkImpl>(Attribs.pSBT);
    const BindingTableVk&           BindingTable = pSBTVk->GetVkBindingTable();

    BufferVkImpl* const pIndirectAttribsVk = PrepareIndirectAttribsBuffer(Attribs.pAttribsBuffer, Attribs.AttribsBufferStateTransitionMode, "Trace rays indirect (DeviceContextVkImpl::TraceRaysIndirect)");
    const Uint64        IndirectBuffOffset = Attribs.ArgsByteOffset + TraceRaysIndirectCommandSBTSize;

    PrepareForRayTracing();
    m_CommandBuffer.TraceRaysIndirect(BindingTable.RaygenShader, BindingTable.MissShader, BindingTable.HitShader, BindingTable.CallableShader,
                                      pIndirectAttribsVk->GetVkDeviceAddress() + IndirectBuffOffset);
    ++m_State.NumCommands;
}